

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O0

int zdd_group_move_backward(DdManager *table,int x,int y)

{
  int iVar1;
  uint local_3c;
  uint local_38;
  int yprev;
  int gybot;
  int gxbot;
  int gxtop;
  int temp;
  int i;
  int size;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  temp = -1;
  gybot = table->subtableZ[x].next;
  local_38 = table->subtableZ[y].next;
  while (table->subtableZ[(int)local_38].next != y) {
    local_38 = table->subtableZ[(int)local_38].next;
  }
  local_3c = local_38;
  i = y;
  size = x;
  do {
    iVar1 = size;
    if (i < size) {
      return temp;
    }
    while (gybot < i) {
      gxbot = table->subtableZ[size].next;
      if (gxbot == size) {
        gxbot = i;
      }
      gxtop = gybot;
      while (table->subtableZ[gxtop].next != size) {
        gxtop = table->subtableZ[gxtop].next;
      }
      table->subtableZ[gxtop].next = i;
      if (table->subtableZ[i].next == i) {
        table->subtableZ[size].next = size;
      }
      else {
        table->subtableZ[size].next = table->subtableZ[i].next;
      }
      if (local_3c == i) {
        local_3c = size;
      }
      else {
        table->subtableZ[(int)local_3c].next = size;
      }
      table->subtableZ[i].next = gxbot;
      temp = cuddZddSwapInPlace(table,size,i);
      if (temp == 0) {
        return 0;
      }
      i = size;
      size = size + -1;
    }
    if ((uint)i < table->subtableZ[i].next) {
      i = table->subtableZ[i].next;
    }
    local_3c = gybot;
    gybot = gybot + 1;
    size = iVar1 + 1;
  } while( true );
}

Assistant:

static int
zdd_group_move_backward(
  DdManager * table,
  int  x,
  int  y)
{
    int        size = -1;
    int        i, temp, gxtop, gxbot, gybot, yprev;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top and bottom of the two groups. */
    gxtop = table->subtableZ[x].next;
    gxbot = x;
    gybot = table->subtableZ[y].next;
    while (table->subtableZ[gybot].next != (unsigned) y)
        gybot = table->subtableZ[gybot].next;
    yprev = gybot;

    while (x <= y) {
        while (y > gxtop) {
            /* Set correct symmetries. */
            temp = table->subtableZ[x].next;
            if (temp == x)
                temp = y;
            i = gxtop;
            for (;;) {
                if (table->subtableZ[i].next == (unsigned) x) {
                    table->subtableZ[i].next = y;
                    break;
                } else {
                    i = table->subtableZ[i].next;
                }
            }
            if (table->subtableZ[y].next != (unsigned) y) {
                table->subtableZ[x].next = table->subtableZ[y].next;
            } else {
                table->subtableZ[x].next = x;
            }

            if (yprev != y) {
                table->subtableZ[yprev].next = x;
            } else {
                yprev = x;
            }
            table->subtableZ[y].next = temp;

            size = cuddZddSwapInPlace(table, x, y);
            if (size == 0)
                return(0);
            y = x;
            x--;
        } /* while y > gxtop */

        /* Trying to find the next y. */
        if (table->subtableZ[y].next <= (unsigned) y) {
            gybot = y;
        } else {
            y = table->subtableZ[y].next;
        }

        yprev = gxtop;
        gxtop++;
        gxbot++;
        x = gxbot;
    } /* while x <= y, end of group movement backward */

    return(size);

}